

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_proto.c
# Opt level: O0

int synthetic_create_request(application_protocol *proto,request *req)

{
  rand_gen *generator_00;
  void *pvVar1;
  long lVar2;
  long *in_FS_OFFSET;
  double __x;
  rand_gen *generator;
  request *req_local;
  application_protocol *proto_local;
  
  generator_00 = (rand_gen *)proto->arg;
  if (*(long *)(*in_FS_OFFSET + -0x178) == 0) {
    pvVar1 = malloc(8);
    *(void **)(*in_FS_OFFSET + -0x178) = pvVar1;
    if (*(long *)(*in_FS_OFFSET + -0x178) == 0) {
      __assert_fail("per_thread_arg",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                    ,0x69,
                    "int synthetic_create_request(struct application_protocol *, struct request *)")
      ;
    }
  }
  __x = generate(generator_00);
  lVar2 = lround(__x);
  *(long *)(*in_FS_OFFSET + -0x178) = lVar2;
  req->iovs[0].iov_base = (void *)(*in_FS_OFFSET + -0x178);
  req->iovs[0].iov_len = 8;
  req->iov_cnt = 1;
  req->meta = (void *)0x0;
  return 0;
}

Assistant:

int synthetic_create_request(struct application_protocol *proto,
							 struct request *req)
{
	struct rand_gen *generator = (struct rand_gen *)proto->arg;

	if (!per_thread_arg) {
		per_thread_arg = malloc(sizeof(long));
		assert(per_thread_arg);
	}
	per_thread_arg = (void *)lround(generate(generator));
	req->iovs[0].iov_base = &per_thread_arg;
	req->iovs[0].iov_len = sizeof(long);
	req->iov_cnt = 1;
	req->meta = NULL;

	return 0;
}